

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void dumpCKx(uint64_t cka,uint64_t value,int size)

{
  ulong in_RSI;
  long in_RDI;
  
  if ((int)in_RSI == -1) {
    printf("CK_UNAVAILABLE_INFORMATION");
  }
  else if (in_RDI == 0) {
    if ((in_RSI & 0xffffffff) == in_RSI) {
      dumpCKO(cka,value._4_4_);
    }
    else {
      printf("overflow object class");
    }
  }
  else if (in_RDI == 0x80) {
    if ((in_RSI & 0xffffffff) == in_RSI) {
      dumpCKC(cka,value._4_4_);
    }
    else {
      printf("overflow certificate type");
    }
  }
  else if (in_RDI == 0x100) {
    if ((in_RSI & 0xffffffff) == in_RSI) {
      dumpCKK(cka,value._4_4_);
    }
    else {
      printf("overflow key type");
    }
  }
  else if (in_RDI == 0x166) {
    if ((in_RSI & 0xffffffff) == in_RSI) {
      dumpCKM(cka,value._4_4_);
    }
    else {
      printf("overflow mechanism type");
    }
  }
  else if (in_RDI == 0x300) {
    if ((in_RSI & 0xffffffff) == in_RSI) {
      dumpCKH(cka,value._4_4_);
    }
    else {
      printf("overflow hw feature type");
    }
  }
  else {
    printf("CK_ULONG %lu(0x%lx)",in_RSI,in_RSI);
  }
  return;
}

Assistant:

void dumpCKx(uint64_t cka, uint64_t value, int size)
{
	if ((uint32_t)value == (uint32_t)~0)
	{
		printf("CK_UNAVAILABLE_INFORMATION");
		return;
	}

	switch ((unsigned long) cka)
	{
	case CKA_CLASS:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow object class");
			break;
		}
		dumpCKO((unsigned long) value, size);
		break;
	case CKA_CERTIFICATE_TYPE:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow certificate type");
			break;
		}
		dumpCKC((unsigned long) value, size);
		break;
	case CKA_KEY_TYPE:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow key type");
			break;
		}
		dumpCKK((unsigned long) value, size);
		break;
	case CKA_KEY_GEN_MECHANISM:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow mechanism type");
			break;
		}
		dumpCKM((unsigned long) value, size);
		break;
	case CKA_HW_FEATURE_TYPE:
		if ((uint64_t)((uint32_t)value) != value)
		{
			printf("overflow hw feature type");
			break;
		}
		dumpCKH((unsigned long) value, size);
		break;
	default:
		printf("CK_ULONG %lu(0x%lx)",
		       (unsigned long) value,
		       (unsigned long) value);
		break;
	}
}